

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O1

void __thiscall
Rml::ControlledLifetimeResource<Rml::ComputedPropertyData>::Shutdown
          (ControlledLifetimeResource<Rml::ComputedPropertyData> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ComputedPropertyData *pCVar2;
  pointer pcVar3;
  code *pcVar4;
  bool bVar5;
  
  if (this->pointer == (ComputedPropertyData *)0x0) {
    bVar5 = Assert("Shutting down resource that was not initialized, or has been shut down already."
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3e);
    if (!bVar5) goto LAB_001e70e1;
  }
  if (this->intentionally_leaked == true) {
    bVar5 = Assert("Shutting down resource that was marked as leaked.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3f);
    if (!bVar5) {
LAB_001e70e1:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  pCVar2 = this->pointer;
  if (pCVar2 != (ComputedPropertyData *)0x0) {
    pcVar3 = (pCVar2->computed).inherited.language._M_dataplus._M_p;
    paVar1 = &(pCVar2->computed).inherited.language.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pCVar2,0xf8);
  }
  this->pointer = (ComputedPropertyData *)0x0;
  return;
}

Assistant:

void Shutdown()
	{
		RMLUI_ASSERTMSG(pointer, "Shutting down resource that was not initialized, or has been shut down already.");
		RMLUI_ASSERTMSG(!intentionally_leaked, "Shutting down resource that was marked as leaked.");
		delete pointer;
		pointer = nullptr;
	}